

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O1

int http_client_execute(http_client *client,http_message *response)

{
  tcp_client *client_00;
  ushort uVar1;
  uri_query *query;
  __int32_t *p_Var2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  __int32_t **pp_Var6;
  ulong uVar7;
  long lVar8;
  uint16_t uVar9;
  size_t sVar10;
  char *pcVar11;
  size_t *psVar12;
  char proto [16];
  http_parser_url hp;
  byte local_68 [16];
  http_parser_url local_58;
  http_parser *local_38;
  
  http_message_init(response);
  client->response = response;
  pcVar11 = (client->request->url).p;
  sVar10 = (client->request->url).len;
  http_parser_url_init(&local_58);
  http_parser_parse_url(pcVar11,sVar10,0,&local_58);
  uVar9 = 0x50;
  if (local_58.port != 0) {
    uVar9 = local_58.port;
  }
  client->port = uVar9;
  if (((byte)local_58.field_set & 0x10) != 0) {
    memcpy(client->query_buffer + client->query_buffer_used,pcVar11 + local_58.field_data[4].off,
           (ulong)local_58.field_data[4].len);
    client->query_buffer_used = client->query_buffer_used + (ulong)local_58.field_data[4].len;
  }
  query = client->request->query;
  if (query->nqueries != 0) {
    sVar10 = client->query_buffer_used;
    sVar3 = uri_query_build(query,client->query_buffer + sVar10,0xc80 - sVar10);
    client->query_buffer_used = sVar3 + sVar10;
  }
  uVar1 = client->request->method;
  pcVar4 = http_method_str((uint)uVar1);
  sVar5 = strlen(pcVar4);
  memcpy((client->request_buffer).p + client->request_buffer_used,pcVar4,sVar5);
  sVar10 = sVar5 + client->request_buffer_used;
  client->request_buffer_used = sVar10;
  (client->request_buffer).p[sVar10] = ' ';
  sVar10 = client->request_buffer_used + 1;
  client->request_buffer_used = sVar10;
  if (((byte)local_58.field_set & 8) != 0) {
    memcpy((client->request_buffer).p + sVar10,pcVar11 + local_58.field_data[3].off,
           (ulong)local_58.field_data[3].len);
    client->request_buffer_used = client->request_buffer_used + (ulong)local_58.field_data[3].len;
  }
  if (uVar1 == 1) {
    (client->request_buffer).p[client->request_buffer_used] = '?';
    sVar10 = client->request_buffer_used + 1;
    client->request_buffer_used = sVar10;
    sVar5 = client->query_buffer_used;
    memcpy((client->request_buffer).p + sVar10,client->query_buffer,sVar5);
    client->request_buffer_used = client->request_buffer_used + sVar5;
  }
  else {
    client->request->content_length = client->query_buffer_used;
    snprintf(_prepare_resquest_number_text,0x10,"%zd");
    http_message_add_header(client->request,"Content-Length",_prepare_resquest_number_text);
    http_message_add_header(client->request,"Content-Type","application/x-www-form-urlencoded");
  }
  (client->request_buffer).p[client->request_buffer_used] = ' ';
  sVar10 = client->request_buffer_used + 1;
  client->request_buffer_used = sVar10;
  if ((ulong)local_58.field_data[0].len == 0) {
    uVar7 = 0;
  }
  else {
    pp_Var6 = __ctype_toupper_loc();
    p_Var2 = *pp_Var6;
    uVar7 = 0;
    do {
      local_68[uVar7] = *(byte *)(p_Var2 + pcVar11[uVar7 + local_58.field_data[0].off]);
      uVar7 = uVar7 + 1;
    } while (local_58.field_data[0].len != uVar7);
  }
  uVar7 = uVar7 & 0xffffffff;
  local_68[uVar7] = 0x2f;
  local_68[uVar7 + 1] =
       (char)client->http_major + ((byte)(client->http_major / 5) & 0xfe) * -5 | 0x30;
  local_68[uVar7 + 2] = 0x2e;
  local_68[uVar7 + 3] =
       (char)client->http_minor + ((byte)(client->http_minor / 5) & 0xfe) * -5 | 0x30;
  memcpy((client->request_buffer).p + sVar10,local_68,uVar7 + 4);
  sVar10 = uVar7 + 4 + client->request_buffer_used;
  client->request_buffer_used = sVar10;
  pcVar4 = (client->request_buffer).p + sVar10;
  pcVar4[0] = '\r';
  pcVar4[1] = '\n';
  sVar10 = client->request_buffer_used;
  client->request_buffer_used = sVar10 + 2;
  if (((byte)local_58.field_set & 2) != 0) {
    builtin_strncpy((client->request_buffer).p + sVar10 + 2,"Host: ",6);
    sVar10 = client->request_buffer_used + 6;
    client->request_buffer_used = sVar10;
    uVar7 = (ulong)local_58.field_data[1].len;
    memcpy((client->request_buffer).p + sVar10,pcVar11 + local_58.field_data[1].off,uVar7);
    client->request_buffer_used = client->request_buffer_used + uVar7;
    memcpy(client->host,pcVar11 + local_58.field_data[1].off,uVar7);
    pcVar11 = (client->request_buffer).p + client->request_buffer_used;
    pcVar11[0] = '\r';
    pcVar11[1] = '\n';
    client->request_buffer_used = client->request_buffer_used + 2;
  }
  if (client->request->nheaders != 0) {
    psVar12 = &client->request->header_values[0].len;
    uVar7 = 0;
    do {
      sVar5 = psVar12[-0x40];
      memcpy((client->request_buffer).p + client->request_buffer_used,(void *)psVar12[-0x41],sVar5);
      sVar10 = sVar5 + client->request_buffer_used;
      client->request_buffer_used = sVar10;
      pcVar11 = (client->request_buffer).p + sVar10;
      pcVar11[0] = ':';
      pcVar11[1] = ' ';
      sVar10 = client->request_buffer_used + 2;
      client->request_buffer_used = sVar10;
      sVar5 = *psVar12;
      memcpy((client->request_buffer).p + sVar10,((ss *)(psVar12 + -1))->p,sVar5);
      sVar10 = sVar5 + client->request_buffer_used;
      client->request_buffer_used = sVar10;
      pcVar11 = (client->request_buffer).p + sVar10;
      pcVar11[0] = '\r';
      pcVar11[1] = '\n';
      client->request_buffer_used = client->request_buffer_used + 2;
      uVar7 = uVar7 + 1;
      psVar12 = psVar12 + 2;
    } while (uVar7 < client->request->nheaders);
  }
  pcVar11 = (client->request_buffer).p + client->request_buffer_used;
  pcVar11[0] = '\r';
  pcVar11[1] = '\n';
  sVar10 = client->request_buffer_used + 2;
  client->request_buffer_used = sVar10;
  if ((client->request->method != 1) && (sVar5 = client->query_buffer_used, sVar5 != 0)) {
    memcpy((client->request_buffer).p + sVar10,client->query_buffer,sVar5);
    sVar10 = sVar5 + client->request_buffer_used;
    client->request_buffer_used = sVar10;
    pcVar11 = (client->request_buffer).p + sVar10;
    pcVar11[0] = '\r';
    pcVar11[1] = '\n';
    client->request_buffer_used = client->request_buffer_used + 2;
  }
  client_00 = &client->connector;
  tcp_client_connect(client_00,client->host,client->port);
  sVar10 = client->request_buffer_used;
  pcVar11 = (client->request_buffer).p;
  do {
    lVar8 = tcp_client_send(client_00,pcVar11,sVar10);
    if (lVar8 < 1) break;
    sVar10 = sVar10 - lVar8;
    pcVar11 = pcVar11 + lVar8;
  } while (0 < (long)sVar10);
  local_38 = &client->parser;
  http_parser_init(local_38,HTTP_RESPONSE);
  (client->parser).data = client;
  pcVar11 = (client->response_buffer).p;
  lVar8 = 0;
  do {
    sVar10 = tcp_client_recv(client_00,pcVar11,(client->response_buffer).len - lVar8);
    if ((long)sVar10 < 1) break;
    http_parser_execute(local_38,&client->settings,pcVar11,sVar10);
    lVar8 = lVar8 + sVar10;
    pcVar11 = pcVar11 + sVar10;
  } while (client->response_complete != true);
  tcp_client_close(client_00);
  return 0;
}

Assistant:

int http_client_execute(http_client* client, http_message* response)
{
    ssize_t nbytes = 0, count = 0, remains = 0;
    char* pos;

    http_message_init(response);
    client->response = response;
    _prepare_resquest(client);
    tcp_client_connect(&client->connector, client->host, client->port);

    count = 0;
    pos = (char*)client->request_buffer.p;
    remains = client->request_buffer_used;
    do {
        nbytes = tcp_client_send(&client->connector, pos, remains);
        remains -= nbytes;
        count += nbytes;
        pos += nbytes;
    } while (nbytes > 0 && remains > 0);

    LOGD("sent count: %ld\n", count);

    // parser reset
    http_parser_init(&client->parser, HTTP_RESPONSE);
    client->parser.data = client;

    count = 0;
    pos = (char*)client->response_buffer.p;
    do {
        nbytes = tcp_client_recv(&client->connector, pos,
                                 client->response_buffer.len - count);
        if (nbytes <= 0) break;
        http_parser_execute(&client->parser, &client->settings, pos, nbytes);
        count += nbytes;
        pos += nbytes;
    } while (!client->response_complete);
    LOGD("recv count: %ld\n", count);

    tcp_client_close(&client->connector);
    return 0;
}